

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhigles2_p.h
# Opt level: O0

void __thiscall QGles2CommandBuffer::resetCommands(QGles2CommandBuffer *this)

{
  QVLABase<QByteArray> *in_RDI;
  
  QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024>::reset
            ((QRhiBackendCommandList<QGles2CommandBuffer::Command,_1024> *)(in_RDI + 2));
  QVLABase<QByteArray>::clear(in_RDI);
  QVLABase<QRhiBufferData>::clear((QVLABase<QRhiBufferData> *)in_RDI);
  QVLABase<QImage>::clear((QVLABase<QImage> *)in_RDI);
  QVLABase<QRhiPassResourceTracker>::clear((QVLABase<QRhiPassResourceTracker> *)in_RDI);
  *(undefined4 *)&((QVLABase<QRhiPassResourceTracker> *)in_RDI)[9].super_QVLABaseBase.a = 0xffffffff
  ;
  return;
}

Assistant:

void resetCommands() {
        commands.reset();
        dataRetainPool.clear();
        bufferDataRetainPool.clear();
        imageRetainPool.clear();

        passResTrackers.clear();
        currentPassResTrackerIndex = -1;
    }